

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void * c4::yml::allocate_impl(size_t length,void *param_2,void *param_3)

{
  void *pvVar1;
  char msg [26];
  char local_28 [40];
  
  pvVar1 = malloc(length);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  builtin_strncpy(local_28 + 0x10,"te memory",10);
  builtin_strncpy(local_28,"could not alloca",0x10);
  report_error_impl(local_28,0x19,(Location)ZEXT1640(ZEXT816(0)),(FILE *)0x0);
  abort();
}

Assistant:

void* allocate_impl(size_t length, void * /*hint*/, void * /*user_data*/)
{
    void *mem = ::malloc(length);
    if(mem == nullptr)
    {
        const char msg[] = "could not allocate memory";
        error_impl(msg, sizeof(msg)-1, {}, nullptr);
    }
    return mem;
}